

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_router.c
# Opt level: O3

void dlep_base_proto_router_init(void)

{
  dlep_extension *pdVar1;
  
  _base = dlep_base_proto_init();
  dlep_extension_add_processing(_base,false,_router_signals,0xf);
  oonf_timer_add(&_peer_discovery_class);
  pdVar1 = _base;
  _base->cb_session_init_router = _cb_init_router;
  pdVar1->cb_session_apply_router = _cb_apply_router;
  pdVar1->cb_session_cleanup_router = _cb_cleanup_router;
  return;
}

Assistant:

void
dlep_base_proto_router_init(void) {
  _base = dlep_base_proto_init();
  dlep_extension_add_processing(_base, false, _router_signals, ARRAYSIZE(_router_signals));

  oonf_timer_add(&_peer_discovery_class);

  _base->cb_session_init_router = _cb_init_router;
  _base->cb_session_apply_router = _cb_apply_router;
  _base->cb_session_cleanup_router = _cb_cleanup_router;
}